

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_sCAL_fixed(png_const_structrp png_ptr,png_inforp info_ptr,int unit,
                       png_fixed_point width,png_fixed_point height)

{
  char local_58 [8];
  char sheight [18];
  char local_38 [8];
  char swidth [18];
  png_fixed_point height_local;
  png_fixed_point width_local;
  int unit_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  swidth._12_4_ = height;
  unique0x100000b9 = width;
  if (width < 1) {
    png_warning(png_ptr,"Invalid sCAL width ignored");
  }
  else if (height < 1) {
    png_warning(png_ptr,"Invalid sCAL height ignored");
  }
  else {
    png_ascii_from_fixed(png_ptr,local_38,0x12,width);
    png_ascii_from_fixed(png_ptr,local_58,0x12,swidth._12_4_);
    png_set_sCAL_s(png_ptr,info_ptr,unit,local_38,local_58);
  }
  return;
}

Assistant:

void PNGAPI
png_set_sCAL_fixed(png_const_structrp png_ptr, png_inforp info_ptr, int unit,
    png_fixed_point width, png_fixed_point height)
{
   png_debug1(1, "in %s storage function", "sCAL");

   /* Check the arguments. */
   if (width <= 0)
      png_warning(png_ptr, "Invalid sCAL width ignored");

   else if (height <= 0)
      png_warning(png_ptr, "Invalid sCAL height ignored");

   else
   {
      /* Convert 'width' and 'height' to ASCII. */
      char swidth[PNG_sCAL_MAX_DIGITS+1];
      char sheight[PNG_sCAL_MAX_DIGITS+1];

      png_ascii_from_fixed(png_ptr, swidth, (sizeof swidth), width);
      png_ascii_from_fixed(png_ptr, sheight, (sizeof sheight), height);

      png_set_sCAL_s(png_ptr, info_ptr, unit, swidth, sheight);
   }
}